

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

string * __thiscall
iutest::detail::ElementsAreMatcherBase::WhichIsElem<3,std::tuple<char,char,char,char,char>>
          (string *__return_storage_ptr__,ElementsAreMatcherBase *this,
          tuple<char,_char,_char,_char,_char> *matchers,int index)

{
  ostream *poVar1;
  iu_global_format_stringstream strm;
  char local_1a9;
  undefined1 local_1a8 [128];
  ios_base local_128 [264];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a8 + 0x10),"ElementsAre(",0xc);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)(local_1a8 + 0x10),(int)matchers);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): ",3);
  local_1a9 = *(char *)((long)&(this->super_IMatcher)._vptr_IMatcher + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1a9,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

static ::std::string WhichIsElem(const T& matchers, int index)
    {
        iu_global_format_stringstream strm;
        strm << "ElementsAre(" << index << "): " << tuples::get<N>(matchers);
        return strm.str();
    }